

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2pnet.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  float fVar1;
  uint uVar2;
  char *pcVar3;
  undefined1 auVar4 [16];
  char cVar5;
  void *pvVar6;
  int i_2;
  long lVar7;
  int i;
  int iVar8;
  uint uVar9;
  float fVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  float fVar16;
  ulong uVar17;
  int i_7;
  uint uVar18;
  int iVar19;
  int w;
  double dVar20;
  double dVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  int target_width;
  int target_height;
  allocator_type local_3f9;
  undefined8 local_3f8;
  undefined4 uStack_3f0;
  undefined4 uStack_3ec;
  Extractor ex;
  undefined4 local_3c4;
  double local_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  Mat anchor_points;
  vector<float,_std::allocator<float>_> all_anchor_points;
  _Vector_base<int,_std::allocator<int>_> local_338;
  float mean_vals1 [3];
  vector<float,_std::allocator<float>_> shifted_anchor_points;
  Mat points;
  vector<CrowdPoint,_std::allocator<CrowdPoint>_> crowd_points;
  vector<float,_std::allocator<float>_> anchor_points_1;
  vector<int,_std::allocator<int>_> strides;
  _Vector_base<float,_std::allocator<float>_> local_240;
  Mat score;
  Mat in;
  float norm_vals1 [3];
  undefined4 uStack_17c;
  vector<int,_std::allocator<int>_> pyramid_levels;
  Net net;
  Option opt;
  Mat bgr;
  undefined8 local_88;
  uchar *local_80;
  
  if (argc == 2) {
    pcVar3 = argv[1];
    std::__cxx11::string::string((string *)&net,pcVar3,(allocator *)&in);
    cv::imread((string *)&bgr,(int)&net);
    std::__cxx11::string::~string((string *)&net);
    cVar5 = cv::Mat::empty();
    if (cVar5 == '\0') {
      crowd_points.super__Vector_base<CrowdPoint,_std::allocator<CrowdPoint>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      crowd_points.super__Vector_base<CrowdPoint,_std::allocator<CrowdPoint>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      crowd_points.super__Vector_base<CrowdPoint,_std::allocator<CrowdPoint>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      ncnn::Option::Option(&opt);
      opt.num_threads = 4;
      opt.use_vulkan_compute = false;
      opt.use_bf16_storage = false;
      ncnn::Net::Net(&net);
      net.opt.num_threads = opt.num_threads;
      net.opt.lightmode = opt.lightmode;
      net.opt._1_3_ = opt._1_3_;
      net.opt.use_vulkan_compute = opt.use_vulkan_compute;
      net.opt.openmp_blocktime = opt.openmp_blocktime;
      net.opt.use_winograd_convolution = opt.use_winograd_convolution;
      net.opt.use_sgemm_convolution = opt.use_sgemm_convolution;
      net.opt.use_int8_inference = opt.use_int8_inference;
      net.opt.use_fp16_packed = opt.use_fp16_packed;
      net.opt.use_fp16_storage = opt.use_fp16_storage;
      net.opt.use_fp16_arithmetic = opt.use_fp16_arithmetic;
      net.opt.use_int8_packed = opt.use_int8_packed;
      net.opt.use_int8_storage = opt.use_int8_storage;
      net.opt.use_int8_arithmetic = opt.use_int8_arithmetic;
      net.opt.use_packing_layout = opt.use_packing_layout;
      net.opt.use_bf16_storage = opt.use_bf16_storage;
      net.opt.flush_denormals = opt.flush_denormals;
      net.opt.use_local_pool_allocator = opt.use_local_pool_allocator;
      net.opt.use_reserved_1 = opt.use_reserved_1;
      net.opt.use_reserved_2 = opt.use_reserved_2;
      net.opt.use_reserved_3 = opt.use_reserved_3;
      net.opt.use_reserved_4 = opt.use_reserved_4;
      net.opt.use_reserved_5 = opt.use_reserved_5;
      net.opt.use_reserved_6 = opt.use_reserved_6;
      net.opt.use_reserved_7 = opt.use_reserved_7;
      net.opt.use_reserved_8 = opt.use_reserved_8;
      net.opt.use_reserved_9 = opt.use_reserved_9;
      net.opt.use_reserved_10 = opt.use_reserved_10;
      net.opt.use_reserved_11 = opt.use_reserved_11;
      net.opt.use_shader_pack8 = opt.use_shader_pack8;
      net.opt.use_subgroup_basic = opt.use_subgroup_basic;
      net.opt.use_subgroup_vote = opt.use_subgroup_vote;
      net.opt.use_subgroup_ballot = opt.use_subgroup_ballot;
      net.opt.use_subgroup_shuffle = opt.use_subgroup_shuffle;
      net.opt.use_image_storage = opt.use_image_storage;
      net.opt.use_tensor_storage = opt.use_tensor_storage;
      net.opt.use_weight_fp16_storage = opt.use_weight_fp16_storage;
      net.opt.workspace_allocator = opt.workspace_allocator;
      net.opt.blob_allocator = opt.blob_allocator;
      ncnn::Net::load_param(&net,"p2pnet.param");
      ncnn::Net::load_model(&net,"p2pnet.bin");
      iVar19 = (int)local_88;
      w = (int)((ulong)local_88 >> 0x20);
      target_width = (w / 0x80) * 0x80;
      target_height = (iVar19 / 0x80) * 0x80;
      ncnn::Mat::from_pixels_resize
                (&in,local_80,0x10002,w,iVar19,target_width,target_height,(Allocator *)0x0);
      anchor_points.data._0_4_ = 3;
      std::vector<int,_std::allocator<int>_>::vector
                (&pyramid_levels,1,(value_type_conflict *)&anchor_points,(allocator_type *)&score);
      all_anchor_points.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      all_anchor_points.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      all_anchor_points.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&local_338,&pyramid_levels);
      _norm_vals1 = (undefined1  [16])0x0;
      strides.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
           = (pointer)0x0;
      strides.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      strides.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_3c0 = (double)in.h;
      uVar15 = 0;
      while( true ) {
        if ((ulong)((long)local_338._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_338._M_impl.super__Vector_impl_data._M_start >> 2) <= uVar15) break;
        dVar20 = ldexp(1.0,local_338._M_impl.super__Vector_impl_data._M_start[uVar15]);
        local_3f8._0_4_ = SUB84(dVar20,0);
        local_3f8._4_4_ = (float)((ulong)dVar20 >> 0x20);
        dVar20 = ldexp(1.0,local_338._M_impl.super__Vector_impl_data._M_start[uVar15]);
        dVar20 = floor(((double)CONCAT44(local_3f8._4_4_,(float)local_3f8) + local_3c0 + -1.0) /
                       dVar20);
        local_3f8._0_4_ = SUB84(dVar20,0);
        local_3f8._4_4_ = (float)((ulong)dVar20 >> 0x20);
        local_3b8 = ldexp(1.0,local_338._M_impl.super__Vector_impl_data._M_start[uVar15]);
        dVar21 = ldexp(1.0,local_338._M_impl.super__Vector_impl_data._M_start[uVar15]);
        dVar20 = (double)CONCAT44(local_3f8._4_4_,(float)local_3f8);
        dVar21 = floor((local_3b8 + (double)in.w + -1.0) / dVar21);
        auVar4 = (undefined1  [16])anchor_points._0_16_;
        anchor_points.data._4_4_ = (int)dVar20;
        anchor_points.data._0_4_ = (int)dVar21;
        anchor_points.refcount = auVar4._8_8_;
        std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
        emplace_back<std::pair<int,int>>
                  ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)norm_vals1,
                   (pair<int,_int> *)&anchor_points);
        dVar20 = ldexp(1.0,local_338._M_impl.super__Vector_impl_data._M_start[uVar15]);
        anchor_points.data._0_4_ = (int)dVar20;
        std::vector<int,_std::allocator<int>_>::emplace_back<int>(&strides,(int *)&anchor_points);
        uVar15 = uVar15 + 1;
      }
      if (all_anchor_points.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          all_anchor_points.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start) {
        all_anchor_points.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_finish =
             all_anchor_points.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
      }
      dVar20 = 0.0;
      while( true ) {
        if ((ulong)((long)local_338._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_338._M_impl.super__Vector_impl_data._M_start >> 2) <= (ulong)dVar20)
        break;
        anchor_points_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        anchor_points_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        anchor_points_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_3c0 = dVar20;
        dVar20 = ldexp(1.0,local_338._M_impl.super__Vector_impl_data._M_start[(long)dVar20]);
        anchor_points.data = (void *)0x0;
        anchor_points.refcount = (int *)0x0;
        anchor_points.elemsize = 0;
        score.data = (void *)0x0;
        score.refcount._0_4_ = 0;
        score.refcount._4_4_ = 0;
        score.elemsize._0_4_ = 0;
        score.elemsize._4_4_ = 0;
        local_3f8 = (double)((float)(int)dVar20 * 0.5);
        local_3b8 = -(double)((int)dVar20 / 2);
        uStack_3b0._0_1_ = false;
        uStack_3b0._1_1_ = false;
        uStack_3b0._2_1_ = false;
        uStack_3b0._3_1_ = false;
        uStack_3b0._4_1_ = false;
        uStack_3b0._5_1_ = false;
        uStack_3b0._6_1_ = false;
        uStack_3b0._7_1_ = true;
        for (iVar8 = 1; iVar8 != 3; iVar8 = iVar8 + 1) {
          points.data = (void *)CONCAT44(points.data._4_4_,
                                         (float)(((double)iVar8 + -0.5) * local_3f8 + local_3b8));
          std::vector<float,_std::allocator<float>_>::push_back
                    ((vector<float,_std::allocator<float>_> *)&anchor_points,
                     (value_type_conflict1 *)&points);
        }
        for (iVar8 = 1; iVar8 != 3; iVar8 = iVar8 + 1) {
          points.data = (void *)CONCAT44(points.data._4_4_,
                                         (float)(((double)iVar8 + -0.5) * local_3f8 + local_3b8));
          std::vector<float,_std::allocator<float>_>::push_back
                    ((vector<float,_std::allocator<float>_> *)&score,(value_type_conflict1 *)&points
                    );
        }
        ex._vptr_Extractor._0_4_ = 0;
        std::vector<float,_std::allocator<float>_>::vector
                  ((vector<float,_std::allocator<float>_> *)&points,4,(value_type_conflict1 *)&ex,
                   (allocator_type *)mean_vals1);
        mean_vals1._0_8_ = mean_vals1._0_8_ & 0xffffffff00000000;
        std::vector<float,_std::allocator<float>_>::vector
                  ((vector<float,_std::allocator<float>_> *)&ex,4,(value_type_conflict1 *)mean_vals1
                   ,(allocator_type *)&shifted_anchor_points);
        pvVar6 = points.data;
        for (lVar7 = 0; lVar7 != 2; lVar7 = lVar7 + 1) {
          for (lVar11 = 0; lVar11 != 2; lVar11 = lVar11 + 1) {
            *(undefined4 *)((long)pvVar6 + lVar11 * 4) =
                 *(undefined4 *)((long)anchor_points.data + lVar11 * 4);
          }
          pvVar6 = (void *)((long)pvVar6 + 8);
        }
        lVar7 = CONCAT44(ex._vptr_Extractor._4_4_,ex._vptr_Extractor._0_4_);
        for (lVar11 = 0; lVar11 != 2; lVar11 = lVar11 + 1) {
          for (lVar12 = 0; lVar12 != 2; lVar12 = lVar12 + 1) {
            *(undefined4 *)(lVar7 + lVar12 * 4) = *(undefined4 *)((long)score.data + lVar11 * 4);
          }
          lVar7 = lVar7 + 8;
        }
        mean_vals1._0_8_ = mean_vals1._0_8_ & 0xffffffff00000000;
        std::vector<float,_std::allocator<float>_>::resize
                  (&anchor_points_1,8,(value_type_conflict1 *)mean_vals1);
        for (lVar7 = 0; lVar7 != 4; lVar7 = lVar7 + 1) {
          fVar1 = *(float *)(CONCAT44(ex._vptr_Extractor._4_4_,ex._vptr_Extractor._0_4_) + lVar7 * 4
                            );
          anchor_points_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start[lVar7 * 2] = *(float *)((long)points.data + lVar7 * 4);
          anchor_points_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start[lVar7 * 2 + 1] = fVar1;
        }
        std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                  ((_Vector_base<float,_std::allocator<float>_> *)&ex);
        std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                  ((_Vector_base<float,_std::allocator<float>_> *)&points);
        std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                  ((_Vector_base<float,_std::allocator<float>_> *)&score);
        std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                  ((_Vector_base<float,_std::allocator<float>_> *)&anchor_points);
        shifted_anchor_points.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        shifted_anchor_points.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        shifted_anchor_points.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        uVar2 = *(uint *)(norm_vals1._0_8_ + (long)local_3c0 * 8);
        fVar1 = *(float *)(norm_vals1._0_8_ + 4 + (long)local_3c0 * 8);
        iVar8 = strides.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[(long)local_3c0];
        std::vector<float,_std::allocator<float>_>::vector
                  ((vector<float,_std::allocator<float>_> *)&local_240,&anchor_points_1);
        anchor_points.elemsize = 0;
        anchor_points._0_16_ = ZEXT816(0);
        score.elemsize._0_4_ = 0;
        score.elemsize._4_4_ = 0;
        score.data = (void *)0x0;
        score.refcount._0_4_ = 0;
        score.refcount._4_4_ = 0;
        local_3f8 = (double)iVar8;
        uVar9 = 0;
        uVar18 = 0;
        if (0 < (int)uVar2) {
          uVar18 = uVar2;
        }
        for (; uVar18 != uVar9; uVar9 = uVar9 + 1) {
          points.data = (void *)CONCAT44(points.data._4_4_,
                                         (float)(((double)(int)uVar9 + 0.5) * local_3f8));
          std::vector<float,_std::allocator<float>_>::push_back
                    ((vector<float,_std::allocator<float>_> *)&anchor_points,
                     (value_type_conflict1 *)&points);
        }
        fVar10 = 0.0;
        fVar16 = 0.0;
        if (0 < (int)fVar1) {
          fVar10 = fVar1;
          fVar16 = 0.0;
        }
        for (; fVar10 != fVar16; fVar16 = (float)((int)fVar16 + 1)) {
          points.data = (void *)CONCAT44(points.data._4_4_,
                                         (float)(((double)(int)fVar16 + 0.5) * local_3f8));
          std::vector<float,_std::allocator<float>_>::push_back
                    ((vector<float,_std::allocator<float>_> *)&score,(value_type_conflict1 *)&points
                    );
        }
        local_3f8._4_4_ = (float)((int)fVar1 >> 0x1f);
        dVar20 = (double)((long)(int)fVar1 * (long)(int)uVar2);
        ex._vptr_Extractor._0_4_ = 0;
        local_3f8._0_4_ = fVar1;
        std::vector<float,_std::allocator<float>_>::vector
                  ((vector<float,_std::allocator<float>_> *)&points,(size_type)dVar20,
                   (value_type_conflict1 *)&ex,(allocator_type *)mean_vals1);
        mean_vals1._0_8_ = mean_vals1._0_8_ & 0xffffffff00000000;
        local_3b8 = dVar20;
        std::vector<float,_std::allocator<float>_>::vector
                  ((vector<float,_std::allocator<float>_> *)&ex,(size_type)dVar20,
                   (value_type_conflict1 *)mean_vals1,(allocator_type *)&local_3c4);
        dVar20 = local_3b8;
        lVar7 = (long)(int)uVar2 * 4;
        lVar11 = 0;
        for (uVar15 = 0; uVar15 != (uint)fVar10; uVar15 = uVar15 + 1) {
          for (uVar14 = 0; uVar18 != uVar14; uVar14 = uVar14 + 1) {
            *(undefined4 *)((long)points.data + uVar14 * 4 + lVar11) =
                 *(undefined4 *)((long)anchor_points.data + uVar14 * 4);
          }
          lVar11 = lVar11 + lVar7;
        }
        lVar11 = 0;
        for (uVar15 = 0; uVar15 != (uint)fVar10; uVar15 = uVar15 + 1) {
          for (uVar14 = 0; uVar18 != uVar14; uVar14 = uVar14 + 1) {
            *(undefined4 *)
             (CONCAT44(ex._vptr_Extractor._4_4_,ex._vptr_Extractor._0_4_) + lVar11 + uVar14 * 4) =
                 *(undefined4 *)((long)score.data + uVar15 * 4);
          }
          lVar11 = lVar11 + lVar7;
        }
        local_3c4 = 0;
        std::vector<float,_std::allocator<float>_>::vector
                  ((vector<float,_std::allocator<float>_> *)mean_vals1,(long)local_3b8 * 2,
                   (value_type_conflict1 *)&local_3c4,&local_3f9);
        uVar15 = (ulong)(uVar2 * (int)(float)local_3f8);
        if ((int)(uVar2 * (int)(float)local_3f8) < 1) {
          uVar15 = 0;
        }
        for (uVar14 = 0; uVar15 != uVar14; uVar14 = uVar14 + 1) {
          *(undefined4 *)(mean_vals1._0_8_ + uVar14 * 8) =
               *(undefined4 *)((long)points.data + uVar14 * 4);
          *(undefined4 *)(mean_vals1._0_8_ + 4 + uVar14 * 8) =
               *(undefined4 *)
                (CONCAT44(ex._vptr_Extractor._4_4_,ex._vptr_Extractor._0_4_) + uVar14 * 4);
        }
        local_3c4 = 0;
        std::vector<float,_std::allocator<float>_>::resize
                  (&shifted_anchor_points,
                   (long)dVar20 *
                   ((long)local_240._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_240._M_impl.super__Vector_impl_data._M_start >> 2) &
                   0x7fffffffffffffff,(value_type_conflict1 *)&local_3c4);
        uVar14 = (long)local_240._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_240._M_impl.super__Vector_impl_data._M_start >> 2;
        lVar7 = 0;
        for (uVar13 = 0; uVar13 != uVar15; uVar13 = uVar13 + 1) {
          lVar11 = lVar7;
          for (uVar17 = 0; uVar14 >> 1 != uVar17; uVar17 = uVar17 + 1) {
            fVar1 = local_240._M_impl.super__Vector_impl_data._M_start[uVar17 * 2 + 1];
            fVar10 = *(float *)(mean_vals1._0_8_ + (uVar13 * 2 + 1) * 4);
            *(float *)((long)shifted_anchor_points.super__Vector_base<float,_std::allocator<float>_>
                             ._M_impl.super__Vector_impl_data._M_start +
                      uVar17 * 8 + (lVar7 * 4 & 0xfffffffffffffff8U)) =
                 local_240._M_impl.super__Vector_impl_data._M_start[uVar17 * 2] +
                 *(float *)(mean_vals1._0_8_ + uVar13 * 8);
            *(float *)((long)shifted_anchor_points.super__Vector_base<float,_std::allocator<float>_>
                             ._M_impl.super__Vector_impl_data._M_start + (lVar11 * 4 | 4U)) =
                 fVar1 + fVar10;
            lVar11 = lVar11 + 2;
          }
          lVar7 = lVar7 + uVar14;
        }
        std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                  ((_Vector_base<float,_std::allocator<float>_> *)mean_vals1);
        std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                  ((_Vector_base<float,_std::allocator<float>_> *)&ex);
        std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                  ((_Vector_base<float,_std::allocator<float>_> *)&points);
        std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                  ((_Vector_base<float,_std::allocator<float>_> *)&score);
        std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                  ((_Vector_base<float,_std::allocator<float>_> *)&anchor_points);
        std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_240);
        std::vector<float,std::allocator<float>>::
        insert<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,void>
                  ((vector<float,std::allocator<float>> *)&all_anchor_points,
                   (const_iterator)
                   all_anchor_points.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_finish,
                   (__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>)
                   shifted_anchor_points.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   (__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>)
                   shifted_anchor_points.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_finish);
        std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                  (&shifted_anchor_points.super__Vector_base<float,_std::allocator<float>_>);
        std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                  (&anchor_points_1.super__Vector_base<float,_std::allocator<float>_>);
        dVar20 = (double)((long)local_3c0 + 1);
      }
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&strides.super__Vector_base<int,_std::allocator<int>_>);
      std::_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~_Vector_base
                ((_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                 norm_vals1);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_338);
      anchor_points.refcount = (int *)0x0;
      anchor_points.data =
           all_anchor_points.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
      anchor_points.elemsize = 4;
      anchor_points.elempack = 1;
      anchor_points.allocator = (Allocator *)0x0;
      anchor_points.dims = 2;
      anchor_points.w = 2;
      anchor_points.h =
           (int)((ulong)((long)all_anchor_points.super__Vector_base<float,_std::allocator<float>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)all_anchor_points.super__Vector_base<float,_std::allocator<float>_>.
                              _M_impl.super__Vector_impl_data._M_start) >> 3);
      anchor_points.d = 1;
      anchor_points.c = 1;
      anchor_points.cstep = (long)anchor_points.h * 2;
      ncnn::Net::create_extractor((Net *)&ex);
      mean_vals1[0] = 123.675;
      mean_vals1[1] = 116.28;
      mean_vals1[2] = 103.53;
      norm_vals1[2] = 0.01742919;
      norm_vals1[0] = 0.01712475;
      norm_vals1[1] = 0.0175;
      ncnn::Mat::substract_mean_normalize(&in,mean_vals1,norm_vals1);
      ncnn::Extractor::input(&ex,"input",&in);
      ncnn::Extractor::input(&ex,"anchor",&anchor_points);
      score.cstep = 0;
      score.data = (void *)0x0;
      score.refcount._0_4_ = 0;
      score.refcount._4_4_ = 0;
      score.elemsize._0_4_ = 0;
      score.elemsize._4_4_ = 0;
      score.elempack = 0;
      score.allocator = (Allocator *)0x0;
      score.dims = 0;
      score.w = 0;
      score.h = 0;
      score.d = 0;
      score.c = 0;
      points.cstep = 0;
      points.data = (void *)0x0;
      points.refcount._0_4_ = 0;
      points.refcount._4_4_ = 0;
      points.elemsize._0_4_ = 0;
      points.elemsize._4_4_ = 0;
      points.elempack = 0;
      points.allocator = (Allocator *)0x0;
      points.dims = 0;
      points.w = 0;
      points.h = 0;
      points.d = 0;
      points.c = 0;
      ncnn::Extractor::extract(&ex,"pred_scores",&score,0);
      ncnn::Extractor::extract(&ex,"pred_points",&points,0);
      local_3f8._0_4_ = (float)target_width;
      local_3f8._4_4_ = (float)target_height;
      uStack_3f0 = 0;
      uStack_3ec = 0;
      local_3b8 = (double)CONCAT44((float)iVar19,(float)w);
      uStack_3b0._0_1_ = false;
      uStack_3b0._1_1_ = false;
      uStack_3b0._2_1_ = false;
      uStack_3b0._3_1_ = false;
      uStack_3b0._4_1_ = false;
      uStack_3b0._5_1_ = false;
      uStack_3b0._6_1_ = false;
      uStack_3b0._7_1_ = false;
      for (lVar7 = 0;
          auVar4 = (undefined1  [16])
                   strides.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._0_16_, lVar7 < points.h; lVar7 = lVar7 + 1) {
        auVar22._8_8_ = 0;
        auVar22._0_8_ =
             *(ulong *)((long)points.data +
                       points.w * lVar7 *
                       CONCAT44(points.elemsize._4_4_,(undefined4)points.elemsize));
        auVar23._4_4_ = local_3f8._4_4_;
        auVar23._0_4_ = (float)local_3f8;
        auVar23._8_4_ = uStack_3f0;
        auVar23._12_4_ = uStack_3ec;
        auVar23 = divps(auVar22,auVar23);
        strides.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start._4_4_ = (int)(auVar23._4_4_ * local_3b8._4_4_);
        strides.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start._0_4_ = (int)(auVar23._0_4_ * (float)local_3b8);
        strides.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish._4_4_ = auVar4._12_4_;
        strides.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish._0_4_ =
             *(undefined4 *)
              ((long)score.data +
              score.w * lVar7 * CONCAT44(score.elemsize._4_4_,(undefined4)score.elemsize) + 4);
        std::vector<CrowdPoint,_std::allocator<CrowdPoint>_>::push_back
                  (&crowd_points,(value_type *)&strides);
      }
      ncnn::Mat::~Mat(&points);
      ncnn::Mat::~Mat(&score);
      ncnn::Extractor::~Extractor(&ex);
      ncnn::Mat::~Mat(&anchor_points);
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                (&all_anchor_points.super__Vector_base<float,_std::allocator<float>_>);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&pyramid_levels.super__Vector_base<int,_std::allocator<int>_>);
      ncnn::Mat::~Mat(&in);
      ncnn::Net::~Net(&net);
      cv::Mat::clone();
      lVar7 = 8;
      for (uVar15 = 0;
          uVar15 < (ulong)(((long)crowd_points.
                                  super__Vector_base<CrowdPoint,_std::allocator<CrowdPoint>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)crowd_points.
                                 super__Vector_base<CrowdPoint,_std::allocator<CrowdPoint>_>._M_impl
                                 .super__Vector_impl_data._M_start) / 0xc); uVar15 = uVar15 + 1) {
        if (0.5 < *(float *)((long)&((crowd_points.
                                      super__Vector_base<CrowdPoint,_std::allocator<CrowdPoint>_>.
                                      _M_impl.super__Vector_impl_data._M_start)->pt).x + lVar7)) {
          anchor_points.elemsize = 0;
          anchor_points.data._0_4_ = 0x3010000;
          anchor_points.refcount = (int *)&net;
          score.data = *(void **)((long)crowd_points.
                                        super__Vector_base<CrowdPoint,_std::allocator<CrowdPoint>_>.
                                        _M_impl.super__Vector_impl_data._M_start + lVar7 + -8);
          cv::Matx<double,_4,_1>::Matx((Matx<double,_4,_1> *)&in);
          in.data = (void *)0x0;
          in.refcount = (int *)0x0;
          in.elemsize = 0x406fe00000000000;
          in.elempack = 0;
          in._28_4_ = 0;
          cv::circle(&anchor_points,&score,4,&in,0xffffffff,8,0);
        }
        lVar7 = lVar7 + 0xc;
      }
      std::__cxx11::string::string((string *)&in,"image",(allocator *)&points);
      anchor_points.elemsize = 0;
      anchor_points.data._0_4_ = 0x1010000;
      anchor_points.refcount = (int *)&net;
      cv::imshow((string *)&in,(_InputArray *)&anchor_points);
      std::__cxx11::string::~string((string *)&in);
      iVar19 = 0;
      cv::waitKey(0);
      cv::Mat::~Mat((Mat *)&net);
      std::_Vector_base<CrowdPoint,_std::allocator<CrowdPoint>_>::~_Vector_base
                (&crowd_points.super__Vector_base<CrowdPoint,_std::allocator<CrowdPoint>_>);
    }
    else {
      fprintf(_stderr,"cv::imread %s failed\n",pcVar3);
      iVar19 = -1;
    }
    cv::Mat::~Mat(&bgr);
  }
  else {
    fprintf(_stderr,"Usage: %s [imagepath]\n",*argv);
    iVar19 = -1;
  }
  return iVar19;
}

Assistant:

int main(int argc, char** argv)
{
    if (argc != 2)
    {
        fprintf(stderr, "Usage: %s [imagepath]\n", argv[0]);
        return -1;
    }

    const char* imagepath = argv[1];

    cv::Mat bgr = cv::imread(imagepath, 1);
    if (bgr.empty())
    {
        fprintf(stderr, "cv::imread %s failed\n", imagepath);
        return -1;
    }

    std::vector<CrowdPoint> crowd_points;
    detect_crowd(bgr, crowd_points);
    draw_result(bgr, crowd_points);

    return 0;
}